

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_Basic_Test::TestBody(QUICMethodTest_Basic_Test *this)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  char *pcVar4;
  pointer psVar5;
  unsigned_long num;
  SSL *to;
  SSL_SESSION *session_00;
  char *in_R9;
  string local_4d0;
  AssertHelper local_4b0;
  Message local_4a8;
  int local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_468;
  Message local_460;
  int local_454;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_420;
  Message local_418;
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__12;
  UniquePtr<SSL_SESSION> session;
  AssertHelper local_3d0;
  Message local_3c8;
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_388;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__10;
  Message local_360;
  int local_358;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2d8;
  Message local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_290;
  Message local_288;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_248;
  Message local_240;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__6;
  Span<const_unsigned_char> write_secret;
  Span<const_unsigned_char> read_secret;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70 [3];
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  SSL_QUIC_METHOD quic_method;
  QUICMethodTest_Basic_Test *this_local;
  
  QUICMethodTest::DefaultQUICMethod
            ((SSL_QUIC_METHOD *)&gtest_ar_.message_,&this->super_QUICMethodTest);
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(nullptr_t)0x0);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  SSL_CTX_set_session_cache_mode(psVar3,3);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar3,SaveLastSession);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  local_4c = SSL_CTX_set_quic_method(psVar3,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_48,&local_4c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_48,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1cae,pcVar4);
    testing::internal::AssertHelper::operator=(local_70,&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_58);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_QUICMethodTest).server_ctx_);
    local_ac = SSL_CTX_set_quic_method(psVar3,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_a8,&local_ac,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a8,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1caf,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_f1 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_f0,
                   (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1cb1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_108,&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_100);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_139 = QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_138,&local_139,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_138,
                     (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1cb2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_148);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_QUICMethodTest).client_);
          iVar2 = SSL_session_reused(psVar5);
          local_181 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_180,&local_181,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_180,
                       (AssertionResult *)"SSL_session_reused(client_.get())","true","false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_198,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cb5,pcVar4);
            testing::internal::AssertHelper::operator=(&local_198,&local_190);
            testing::internal::AssertHelper::~AssertHelper(&local_198);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_190);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_QUICMethodTest).server_);
          iVar2 = SSL_session_reused(psVar5);
          local_1c9 = (bool)((iVar2 != 0 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
          if (!bVar1) {
            testing::Message::Message(&local_1d8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&read_secret.size_,(internal *)local_1c8,
                       (AssertionResult *)"SSL_session_reused(server_.get())","true","false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cb6,pcVar4);
            testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
            testing::internal::AssertHelper::~AssertHelper(&local_1e0);
            std::__cxx11::string::~string((string *)&read_secret.size_);
            testing::Message::~Message(&local_1d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
          Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&write_secret.size_);
          Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&gtest_ar__6.message_);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_QUICMethodTest).client_);
          bVar1 = SSL_get_traffic_secrets
                            (psVar5,(Span<const_unsigned_char> *)&write_secret.size_,
                             (Span<const_unsigned_char> *)&gtest_ar__6.message_);
          local_231 = (bool)((bVar1 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_230,&local_231,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
          if (!bVar1) {
            testing::Message::Message(&local_240);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_230,
                       (AssertionResult *)
                       "SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret)","true",
                       "false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cbb,pcVar4);
            testing::internal::AssertHelper::operator=(&local_248,&local_240);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_240);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_QUICMethodTest).server_);
          bVar1 = SSL_get_traffic_secrets
                            (psVar5,(Span<const_unsigned_char> *)&write_secret.size_,
                             (Span<const_unsigned_char> *)&gtest_ar__6.message_);
          local_279 = (bool)((bVar1 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_278,&local_279,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
          if (!bVar1) {
            testing::Message::Message(&local_288);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__8.message_,(internal *)local_278,
                       (AssertionResult *)
                       "SSL_get_traffic_secrets(server_.get(), &read_secret, &write_secret)","true",
                       "false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_290,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cbd,pcVar4);
            testing::internal::AssertHelper::operator=(&local_290,&local_288);
            testing::internal::AssertHelper::~AssertHelper(&local_290);
            std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
            testing::Message::~Message(&local_288);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&(anonymous_namespace)::g_last_session);
          local_2c1 = (bool)((bVar1 ^ 0xffU) & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
          if (!bVar1) {
            testing::Message::Message(&local_2d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__9.message_,(internal *)local_2c0,
                       (AssertionResult *)"g_last_session","true","false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc0,pcVar4);
            testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
            testing::internal::AssertHelper::~AssertHelper(&local_2d8);
            std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
            testing::Message::~Message(&local_2d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_QUICMethodTest).client_);
          num = std::numeric_limits<unsigned_long>::max();
          local_309 = QUICMethodTest::ProvideHandshakeData(psVar5,num);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_308,&local_309,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
          if (!bVar1) {
            testing::Message::Message(&local_318);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_308,
                       (AssertionResult *)"ProvideHandshakeData(client_.get())","false","true",in_R9
                      );
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_320,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1cc1,pcVar4);
            testing::internal::AssertHelper::operator=(&local_320,&local_318);
            testing::internal::AssertHelper::~AssertHelper(&local_320);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_318);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                               (&(this->super_QUICMethodTest).client_);
            local_354 = SSL_process_quic_post_handshake(psVar5);
            local_358 = 1;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_350,"SSL_process_quic_post_handshake(client_.get())","1",
                       &local_354,&local_358);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
            if (!bVar1) {
              testing::Message::Message(&local_360);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__10.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1cc2,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__10.message_,&local_360);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10.message_)
              ;
              testing::Message::~Message(&local_360);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_378,
                       (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                       &(anonymous_namespace)::g_last_session,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
            if (!bVar1) {
              testing::Message::Message(&local_380);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__11.message_,(internal *)local_378,
                         (AssertionResult *)"g_last_session","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_388,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1cc3,pcVar4);
              testing::internal::AssertHelper::operator=(&local_388,&local_380);
              testing::internal::AssertHelper::~AssertHelper(&local_388);
              std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
              testing::Message::~Message(&local_380);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
            local_3b9 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_3b8,&local_3b9,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
            if (!bVar1) {
              testing::Message::Message(&local_3c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&session,(internal *)local_3b8,
                         (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3d0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1cc6,pcVar4);
              testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
              testing::internal::AssertHelper::~AssertHelper(&local_3d0);
              std::__cxx11::string::~string((string *)&session);
              testing::Message::~Message(&local_3c8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::unique_ptr
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                         &gtest_ar__12.message_,
                         (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                         &(anonymous_namespace)::g_last_session);
              to = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    (&(this->super_QUICMethodTest).client_);
              session_00 = (SSL_SESSION *)
                           std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__12.message_);
              SSL_set_session(to,session_00);
              local_409 = QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_408,&local_409,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
              if (!bVar1) {
                testing::Message::Message(&local_418);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__13.message_,(internal *)local_408,
                           (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_420,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1cca,pcVar4);
                testing::internal::AssertHelper::operator=(&local_420,&local_418);
                testing::internal::AssertHelper::~AssertHelper(&local_420);
                std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                testing::Message::~Message(&local_418);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_QUICMethodTest).client_);
                local_454 = SSL_session_reused(psVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_450,&local_454,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_450);
                if (!bVar1) {
                  testing::Message::Message(&local_460);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__14.message_,(internal *)local_450,
                             (AssertionResult *)"SSL_session_reused(client_.get())","false","true",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_468,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1ccd,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_468,&local_460);
                  testing::internal::AssertHelper::~AssertHelper(&local_468);
                  std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                  testing::Message::~Message(&local_460);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
                psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                   (&(this->super_QUICMethodTest).server_);
                local_49c = SSL_session_reused(psVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_498,&local_49c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_498);
                if (!bVar1) {
                  testing::Message::Message(&local_4a8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_4d0,(internal *)local_498,
                             (AssertionResult *)"SSL_session_reused(server_.get())","false","true",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4b0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1cce,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
                  testing::internal::AssertHelper::~AssertHelper(&local_4b0);
                  std::__cxx11::string::~string((string *)&local_4d0);
                  testing::Message::~Message(&local_4a8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ = 0;
              }
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                         &gtest_ar__12.message_);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, Basic) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  g_last_session = nullptr;

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_sess_set_new_cb(client_ctx_.get(), SaveLastSession);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  ExpectHandshakeSuccess();
  EXPECT_FALSE(SSL_session_reused(client_.get()));
  EXPECT_FALSE(SSL_session_reused(server_.get()));

  // SSL_get_traffic_secrets is not defined for QUIC.
  Span<const uint8_t> read_secret, write_secret;
  EXPECT_FALSE(
      SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret));
  EXPECT_FALSE(
      SSL_get_traffic_secrets(server_.get(), &read_secret, &write_secret));

  // The server sent NewSessionTicket messages in the handshake.
  EXPECT_FALSE(g_last_session);
  ASSERT_TRUE(ProvideHandshakeData(client_.get()));
  EXPECT_EQ(SSL_process_quic_post_handshake(client_.get()), 1);
  EXPECT_TRUE(g_last_session);

  // Create a second connection to verify resumption works.
  ASSERT_TRUE(CreateClientAndServer());
  bssl::UniquePtr<SSL_SESSION> session = std::move(g_last_session);
  SSL_set_session(client_.get(), session.get());

  ASSERT_TRUE(CompleteHandshakesForQUIC());

  ExpectHandshakeSuccess();
  EXPECT_TRUE(SSL_session_reused(client_.get()));
  EXPECT_TRUE(SSL_session_reused(server_.get()));
}